

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddBYEPacket
          (RTCPCompoundPacketBuilder *this,uint32_t *ssrcs,uint8_t numssrcs,void *reasondata,
          uint8_t reasonlength)

{
  size_t sVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ushort uVar5;
  int iVar6;
  size_t numbytes;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  value_type local_40;
  
  if (this->arebuilding == true) {
    if (numssrcs < 0x20) {
      lVar10 = (ulong)numssrcs * 4;
      sVar1 = lVar10 + 4;
      if (reasonlength == '\0') {
        lVar11 = 0;
        numbytes = sVar1;
      }
      else {
        uVar9 = (ulong)(reasonlength + 1 & 3);
        lVar11 = 4 - uVar9;
        if (uVar9 == 0) {
          lVar11 = 0;
        }
        numbytes = lVar11 + reasonlength + sVar1 + 1;
      }
      sVar3 = this->appsize;
      sVar4 = this->byesize;
      sVar7 = SDES::NeededBytes(&this->sdes);
      sVar8 = Report::NeededBytes(&this->report);
      if (this->maximumpacketsize < sVar8 + sVar7 + sVar3 + numbytes + sVar4) {
        iVar6 = -0x2b;
      }
      else {
        local_40.packetdata =
             (uint8_t *)
             operator_new__(numbytes,(this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,4);
        if (local_40.packetdata == (byte *)0x0) {
          iVar6 = -1;
        }
        else {
          uVar5 = (ushort)(((uint)(numbytes >> 2) & 0x3fffffff) - 1);
          *local_40.packetdata = numssrcs | 0x80;
          *(ushort *)(local_40.packetdata + 2) = uVar5 << 8 | uVar5 >> 8;
          local_40.packetdata[1] = 0xcb;
          for (uVar9 = 0; numssrcs != uVar9; uVar9 = uVar9 + 1) {
            uVar2 = ssrcs[uVar9];
            *(uint *)(local_40.packetdata + uVar9 * 4 + 4) =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          }
          if (reasonlength != '\0') {
            local_40.packetdata[sVar1] = reasonlength;
            memcpy(local_40.packetdata + lVar10 + 5,reasondata,(ulong)reasonlength);
            for (lVar10 = 0; -lVar10 != lVar11; lVar10 = lVar10 + -1) {
              local_40.packetdata[lVar10 + (numbytes - 1)] = 0;
            }
          }
          local_40.packetlength = numbytes;
          std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
          ::push_back(&this->byepackets,&local_40);
          this->byesize = this->byesize + numbytes;
          iVar6 = 0;
        }
      }
    }
    else {
      iVar6 = -0x2d;
    }
    return iVar6;
  }
  return -0x2a;
}

Assistant:

int RTCPCompoundPacketBuilder::AddBYEPacket(uint32_t *ssrcs,uint8_t numssrcs,const void *reasondata,uint8_t reasonlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (numssrcs > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOOMANYSSRCS;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*((size_t)numssrcs);
	size_t zerobytes = 0;
	
	if (reasonlength > 0)
	{
		packsize += 1; // 1 byte for the length;
		packsize += (size_t)reasonlength;

		size_t r = (packsize&0x03);
		if (r != 0)
		{
			zerobytes = 4-r;
			packsize += zerobytes;
		}
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t numwords;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = numssrcs;
	
	numwords = packsize/sizeof(uint32_t);
	hdr->length = htons((uint16_t)(numwords-1));
	hdr->packettype = RTP_RTCPTYPE_BYE;
	
	uint32_t *sources = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	uint8_t srcindex;
	
	for (srcindex = 0 ; srcindex < numssrcs ; srcindex++)
		sources[srcindex] = htonl(ssrcs[srcindex]);

	if (reasonlength != 0)
	{
		size_t offset = sizeof(RTCPCommonHeader)+((size_t)numssrcs)*sizeof(uint32_t);

		buf[offset] = reasonlength;
		memcpy((buf+offset+1),reasondata,(size_t)reasonlength);
		for (size_t i = 0 ; i < zerobytes ; i++)
			buf[packsize-1-i] = 0;
	}

	byepackets.push_back(Buffer(buf,packsize));
	byesize += packsize;
	
	return 0;
}